

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint64_t helper_lq_be_parallel(CPUPPCState_conflict2 *env,target_ulong addr,uint32_t opidx)

{
  undefined1 a [16];
  undefined1 a_00 [16];
  Int128 *pIVar1;
  uint64_t uVar2;
  undefined8 extraout_RDX;
  uintptr_t in_R8;
  TCGMemOpIdx unaff_retaddr;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  Int128 ret;
  uint32_t opidx_local;
  target_ulong addr_local;
  CPUPPCState_conflict2 *env_local;
  
  pIVar1 = helper_atomic_ldo_be_mmu_ppc64
                     ((Int128 *)env,(CPUArchState_conflict21 *)addr,(ulong)opidx,unaff_retaddr,in_R8
                     );
  a._8_8_ = in_stack_ffffffffffffffa0;
  a._0_8_ = in_stack_ffffffffffffff98;
  uVar2 = int128_gethi((Int128)a);
  env->retxh = uVar2;
  a_00._8_8_ = extraout_RDX;
  a_00._0_8_ = pIVar1;
  uVar2 = int128_getlo((Int128)a_00);
  return uVar2;
}

Assistant:

uint64_t helper_lq_be_parallel(CPUPPCState *env, target_ulong addr,
                               uint32_t opidx)
{
    Int128 ret;

    /* We will have raised EXCP_ATOMIC from the translator.  */
    assert(HAVE_ATOMIC128);
    ret = helper_atomic_ldo_be_mmu(env, addr, opidx, GETPC());
    env->retxh = int128_gethi(ret);
    return int128_getlo(ret);
}